

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.cpp
# Opt level: O1

void __thiscall Pager::_open(Pager *this,string *filename)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = open((filename->_M_dataplus)._M_p,0x42,0x180);
  this->fileDescriptor = iVar1;
  if (iVar1 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Unable to open file\n",0x14);
  }
  uVar2 = lseek(this->fileDescriptor,0,2);
  this->fileLength = (uint32_t)uVar2;
  this->numOfPages = (uint)(uVar2 >> 0xc) & 0xfffff;
  if ((uVar2 & 0xfff) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"DB file is corrupt!\n",0x14);
    return;
  }
  return;
}

Assistant:

void Pager::_open(std::string filename) {
	fileDescriptor = open(filename.c_str(), O_RDWR | O_CREAT, S_IRUSR | S_IWUSR);
	if (fileDescriptor == -1) {
		std::cout << "Unable to open file\n";
	}

	fileLength = lseek(fileDescriptor, 0, SEEK_END);
	numOfPages = fileLength / PAGE_SIZE;

	if (fileLength % PAGE_SIZE != 0) {
		std::cout << "DB file is corrupt!\n";
	}
}